

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double y_;
  double x_;
  double y__00;
  Node *p_00;
  Node *r;
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  double *pdVar4;
  Node *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  double dVar5;
  Node *p;
  int32_t maxZ;
  int32_t minZ;
  double maxTY;
  double maxTX;
  double minTY;
  double minTX;
  Node *c;
  Node *b;
  Node *a;
  Node *local_60;
  
  p_00 = in_RSI->prev;
  r = in_RSI->next;
  dVar5 = area(in_RDI,p_00,in_RSI,r);
  if (dVar5 < 0.0) {
    pdVar4 = std::min<double>(&in_RSI->x,&r->x);
    pdVar4 = std::min<double>(&p_00->x,pdVar4);
    dVar5 = *pdVar4;
    pdVar4 = std::min<double>(&in_RSI->y,&r->y);
    pdVar4 = std::min<double>(&p_00->y,pdVar4);
    y_ = *pdVar4;
    pdVar4 = std::max<double>(&in_RSI->x,&r->x);
    pdVar4 = std::max<double>(&p_00->x,pdVar4);
    x_ = *pdVar4;
    pdVar4 = std::max<double>(&in_RSI->y,&r->y);
    pdVar4 = std::max<double>(&p_00->y,pdVar4);
    y__00 = *pdVar4;
    iVar2 = zOrder(in_RDI,dVar5,y_);
    iVar3 = zOrder(in_RDI,x_,y__00);
    local_60 = in_RSI->nextZ;
    while( true ) {
      bVar1 = false;
      if (local_60 != (Node *)0x0) {
        bVar1 = local_60->z <= iVar3;
      }
      if (!bVar1) {
        local_60 = in_RSI->prevZ;
        while( true ) {
          bVar1 = false;
          if (local_60 != (Node *)0x0) {
            bVar1 = iVar2 <= local_60->z;
          }
          if (!bVar1) break;
          if ((((local_60 != in_RSI->prev) && (local_60 != in_RSI->next)) &&
              (bVar1 = pointInTriangle(in_RDI,p_00->x,p_00->y,in_RSI->x,in_RSI->y,r->x,r->y,
                                       local_60->x,local_60->y), bVar1)) &&
             (dVar5 = area(in_RDI,local_60->prev,local_60,local_60->next), 0.0 <= dVar5)) {
            return false;
          }
          local_60 = local_60->prevZ;
        }
        return true;
      }
      if (((local_60 != in_RSI->prev) && (local_60 != in_RSI->next)) &&
         ((bVar1 = pointInTriangle(in_RDI,p_00->x,p_00->y,in_RSI->x,in_RSI->y,r->x,r->y,local_60->x,
                                   local_60->y), bVar1 &&
          (dVar5 = area(in_RDI,local_60->prev,local_60,local_60->next), 0.0 <= dVar5)))) break;
      local_60 = local_60->nextZ;
    }
  }
  return false;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}